

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhysicalDevice.cpp
# Opt level: O2

vector<std::shared_ptr<myvk::PhysicalDevice>,_std::allocator<std::shared_ptr<myvk::PhysicalDevice>_>_>
* myvk::PhysicalDevice::Fetch
            (vector<std::shared_ptr<myvk::PhysicalDevice>,_std::allocator<std::shared_ptr<myvk::PhysicalDevice>_>_>
             *__return_storage_ptr__,Ptr<Instance> *instance)

{
  long lVar1;
  uint32_t i;
  ulong uVar2;
  uint32_t device_count;
  vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> devices;
  uint32_t local_5c;
  __shared_ptr<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2> local_58;
  _Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> local_48;
  
  local_5c = 0;
  (*vkEnumeratePhysicalDevices)
            (((instance->super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             m_instance,&local_5c,(VkPhysicalDevice *)0x0);
  std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::vector
            ((vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *)&local_48,
             (ulong)local_5c,(allocator_type *)&local_58);
  (*vkEnumeratePhysicalDevices)
            (((instance->super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             m_instance,&local_5c,local_48._M_impl.super__Vector_impl_data._M_start);
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<myvk::PhysicalDevice>,_std::allocator<std::shared_ptr<myvk::PhysicalDevice>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<myvk::PhysicalDevice>,_std::allocator<std::shared_ptr<myvk::PhysicalDevice>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<myvk::PhysicalDevice>,_std::allocator<std::shared_ptr<myvk::PhysicalDevice>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<myvk::PhysicalDevice>,_std::allocator<std::shared_ptr<myvk::PhysicalDevice>_>_>
  ::resize(__return_storage_ptr__,(ulong)local_5c);
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < local_5c; uVar2 = uVar2 + 1) {
    std::
    make_shared<myvk::PhysicalDevice,std::shared_ptr<myvk::Instance>const&,VkPhysicalDevice_T*&>
              ((shared_ptr<myvk::Instance> *)&local_58,(VkPhysicalDevice_T **)instance);
    std::__shared_ptr<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((__return_storage_ptr__->
                         super__Vector_base<std::shared_ptr<myvk::PhysicalDevice>,_std::allocator<std::shared_ptr<myvk::PhysicalDevice>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
               + lVar1),&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    lVar1 = lVar1 + 0x10;
  }
  std::_Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::~_Vector_base
            (&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Ptr<PhysicalDevice>> PhysicalDevice::Fetch(const Ptr<Instance> &instance) {
	uint32_t device_count = 0;
	vkEnumeratePhysicalDevices(instance->GetHandle(), &device_count, nullptr);
	std::vector<VkPhysicalDevice> devices(device_count);
	vkEnumeratePhysicalDevices(instance->GetHandle(), &device_count, devices.data());

	std::vector<Ptr<PhysicalDevice>> ret;
	ret.resize(device_count);
	for (uint32_t i = 0; i < device_count; ++i) {
		ret[i] = std::make_shared<PhysicalDevice>(instance, devices[i]);
	}
	return ret;
}